

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *pfVar2;
  pointer __p;
  ulong uVar3;
  _Head_base<0UL,_std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_*,_false> local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  thread local_30;
  
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jasonboer[P]header-only-thread-local-storage/example.cpp:97:21)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jasonboer[P]header-only-thread-local-storage/example.cpp:97:21)>
             ::_M_manager;
  pfVar2 = (function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)operator_new(0x20);
  std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>::function
            (pfVar2,(function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)&local_58);
  local_60._M_head_impl = (function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)0x0;
  std::
  __uniq_ptr_impl<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
  ::reset((__uniq_ptr_impl<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
           *)&TLS::BASE<tls_data_t,1024u>::_details::_thread_exit_callback,pfVar2);
  std::
  unique_ptr<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
  ::~unique_ptr((unique_ptr<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
                 *)&local_60);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  local_58._M_unused._M_object = (long *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jasonboer[P]header-only-thread-local-storage/example.cpp:108:22)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jasonboer[P]header-only-thread-local-storage/example.cpp:108:22)>
             ::_M_manager;
  pfVar2 = (function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)operator_new(0x20);
  std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>::function
            (pfVar2,(function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)&local_58);
  local_60._M_head_impl = (function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)0x0;
  std::
  __uniq_ptr_impl<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
  ::reset((__uniq_ptr_impl<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
           *)&TLS::BASE<tls_data_t,1024u>::_details::_thread_enter_callback,pfVar2);
  std::
  unique_ptr<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
  ::~unique_ptr((unique_ptr<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
                 *)&local_60);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  if (main::n_threads == '\0') {
    iVar1 = __cxa_guard_acquire(&main::n_threads);
    if (iVar1 != 0) {
      iVar1 = std::thread::hardware_concurrency();
      main::n_threads = (size_t)(uint)(iVar1 * 5);
      __cxa_guard_release(&main::n_threads);
    }
  }
  if (main::threads == '\0') {
    iVar1 = __cxa_guard_acquire(&main::threads);
    if (iVar1 != 0) {
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                (&main::threads,main::n_threads,(allocator_type *)local_58._M_pod_data);
      __cxa_atexit(std::vector<std::thread,_std::allocator<std::thread>_>::~vector,&main::threads,
                   &__dso_handle);
      __cxa_guard_release(&main::threads);
    }
  }
  local_60._M_head_impl = (function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)0x0;
  while( true ) {
    if ((function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)
        ((long)main::threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)main::threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) <= local_60._M_head_impl) break;
    local_30._M_id._M_thread = (id)0;
    local_58._M_unused._M_object = operator_new(0x10);
    *(undefined ***)local_58._M_unused._0_8_ = &PTR___State_00104d98;
    *(_Head_base<0UL,_std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_*,_false> **)
     ((long)local_58._M_unused._0_8_ + 8) = &local_60;
    std::thread::_M_start_thread(&local_30,&local_58,0);
    if ((long *)local_58._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_58._M_unused._M_object + 8))();
    }
    std::thread::operator=
              (main::threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start + (long)local_60._M_head_impl,&local_30);
    std::thread::~thread(&local_30);
    local_60._M_head_impl =
         (function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)
         ((long)&((local_60._M_head_impl)->super__Function_base)._M_functor + 1);
  }
  for (uVar3 = 0;
      uVar3 < (ulong)((long)main::threads.
                            super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)main::threads.
                            super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    std::thread::join();
  }
  printf("n_threads: %u\n",main::n_threads & 0xffffffff);
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	(void)argv;
	(void)argc;

#ifdef TLS_DEBUG_
	tls::debug();
#endif

	auto thread_exit = [](tls::data_t & data) {
		assert(data._data.ptr != nullptr);
		printf("exit:%" PRIxPTR" %p\n", data._id, data._data.ptr);
		delete data._data.ptr;
		data._data.ptr = nullptr;
	};

	// tls::thread_exit() will be call once per thread when it exits - the calling thread will not be the acquire thread
	// try not to do heavy lifting in the callback as it could cause performance problems
	tls::thread_exit(thread_exit);

	auto thread_enter = [](tls::data_t & data) {
		assert(data._data.ptr == nullptr);
		printf("enter:%" PRIxPTR" %p\n", data._id, data._data.ptr);
		data._data.ptr = new int;
	};

	// tls::thread_enter() will be call on the first tls::acquire() once per thread - calling thread will be the aquire thread
	tls::thread_enter(thread_enter);

	static const size_t n_threads = std::thread::hardware_concurrency() * 5;
//	static const size_t n_threads = 1024;
	static std::vector<std::thread> threads(n_threads);

	for (size_t i = 0; i < threads.size(); ++i) {
		threads[i] = std::thread([&] { test(i); });
	}

	for (size_t i = 0; i < threads.size(); ++i) {
		threads[i].join();
	}

	printf("n_threads: %u\n", (uint32_t)n_threads);

	return 0;
}